

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

Abc_Obj_t * Abc_NodeFromMapPhase_rec(Abc_Ntk_t *pNtkNew,Map_Node_t *pNodeMap,int fPhase)

{
  int iVar1;
  uint uVar2;
  Map_Cut_t *pMVar3;
  Map_Super_t *pSuper;
  Map_Node_t **ppMVar4;
  Abc_Obj_t *pAVar5;
  int nLeaves;
  int fInvPin;
  int i;
  uint uPhaseBest;
  Map_Super_t *pSuperBest;
  Map_Cut_t *pCutBest;
  Map_Node_t **ppLeaves;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNodePIs [10];
  int fPhase_local;
  Map_Node_t *pNodeMap_local;
  Abc_Ntk_t *pNtkNew_local;
  
  pNodePIs[9]._4_4_ = fPhase;
  pMVar3 = Map_NodeReadCutBest(pNodeMap,fPhase);
  if ((pMVar3 == (Map_Cut_t *)0x0) && (iVar1 = Map_NodeIsConst(pNodeMap), iVar1 == 0)) {
    __assert_fail("Map_NodeReadCutBest(pNodeMap, fPhase) != NULL || Map_NodeIsConst(pNodeMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                  ,0x168,"Abc_Obj_t *Abc_NodeFromMapPhase_rec(Abc_Ntk_t *, Map_Node_t *, int)");
  }
  pNtkNew_local = (Abc_Ntk_t *)Map_NodeReadData(pNodeMap,pNodePIs[9]._4_4_);
  if (pNtkNew_local == (Abc_Ntk_t *)0x0) {
    pMVar3 = Map_NodeReadCutBest(pNodeMap,pNodePIs[9]._4_4_);
    pSuper = Map_CutReadSuperBest(pMVar3,pNodePIs[9]._4_4_);
    uVar2 = Map_CutReadPhaseBest(pMVar3,pNodePIs[9]._4_4_);
    iVar1 = Map_CutReadLeavesNum(pMVar3);
    ppMVar4 = Map_CutReadLeaves(pMVar3);
    for (nLeaves = 0; nLeaves < iVar1; nLeaves = nLeaves + 1) {
      pAVar5 = Abc_NodeFromMap_rec(pNtkNew,ppMVar4[nLeaves],
                                   (uint)(((uVar2 & 1 << ((byte)nLeaves & 0x1f)) != 0 ^ 0xffU) & 1))
      ;
      pNodePIs[(long)nLeaves + -1] = pAVar5;
      if (pNodePIs[(long)nLeaves + -1] == (Abc_Obj_t *)0x0) {
        __assert_fail("pNodePIs[i] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                      ,0x17a,"Abc_Obj_t *Abc_NodeFromMapPhase_rec(Abc_Ntk_t *, Map_Node_t *, int)");
      }
    }
    pNtkNew_local = (Abc_Ntk_t *)Abc_NodeFromMapSuper_rec(pNtkNew,pNodeMap,pSuper,&pNodeNew,iVar1);
    Map_NodeSetData(pNodeMap,pNodePIs[9]._4_4_,(char *)pNtkNew_local);
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NodeFromMapPhase_rec( Abc_Ntk_t * pNtkNew, Map_Node_t * pNodeMap, int fPhase )
{
    Abc_Obj_t * pNodePIs[10];
    Abc_Obj_t * pNodeNew;
    Map_Node_t ** ppLeaves;
    Map_Cut_t * pCutBest;
    Map_Super_t * pSuperBest;
    unsigned uPhaseBest;
    int i, fInvPin, nLeaves;

    // make sure the node can be implemented in this phase
    assert( Map_NodeReadCutBest(pNodeMap, fPhase) != NULL || Map_NodeIsConst(pNodeMap) );
    // check if the phase is already implemented
    pNodeNew = (Abc_Obj_t *)Map_NodeReadData( pNodeMap, fPhase );
    if ( pNodeNew )
        return pNodeNew;

    // get the information about the best cut 
    pCutBest   = Map_NodeReadCutBest( pNodeMap, fPhase );
    pSuperBest = Map_CutReadSuperBest( pCutBest, fPhase );
    uPhaseBest = Map_CutReadPhaseBest( pCutBest, fPhase );
    nLeaves    = Map_CutReadLeavesNum( pCutBest );
    ppLeaves   = Map_CutReadLeaves( pCutBest );

    // collect the PI nodes
    for ( i = 0; i < nLeaves; i++ )
    {
        fInvPin = ((uPhaseBest & (1 << i)) > 0);
        pNodePIs[i] = Abc_NodeFromMap_rec( pNtkNew, ppLeaves[i], !fInvPin );
        assert( pNodePIs[i] != NULL );
    }

    // implement the supergate
    pNodeNew = Abc_NodeFromMapSuper_rec( pNtkNew, pNodeMap, pSuperBest, pNodePIs, nLeaves );
    Map_NodeSetData( pNodeMap, fPhase, (char *)pNodeNew );
    return pNodeNew;
}